

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoMode.cpp
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<sf::VideoMode*,std::vector<sf::VideoMode,std::allocator<sf::VideoMode>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<sf::VideoMode>>>
               (undefined8 *__result,uint *__a,uint *__b,uint *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  bool bVar5;
  
  uVar1 = __b[2];
  uVar2 = __a[2];
  bVar5 = uVar1 < uVar2;
  if ((uVar1 == uVar2) && (bVar5 = *__b < *__a, *__b == *__a)) {
    bVar5 = __b[1] < __a[1];
  }
  uVar3 = __c[2];
  if (bVar5) {
    bVar5 = uVar3 < uVar1;
    if ((uVar3 == uVar1) && (bVar5 = *__c < *__b, *__c == *__b)) {
      bVar5 = __c[1] < __b[1];
    }
    if (bVar5) {
LAB_0018e630:
      uVar1 = *(uint *)(__result + 1);
      uVar4 = *__result;
      *(uint *)(__result + 1) = __b[2];
      *__result = *(undefined8 *)__b;
      __b[2] = uVar1;
      *(undefined8 *)__b = uVar4;
      return;
    }
    bVar5 = uVar3 < uVar2;
    if ((uVar3 == uVar2) && (bVar5 = *__c < *__a, *__c == *__a)) {
      bVar5 = __c[1] < __a[1];
    }
    if (bVar5) {
LAB_0018e605:
      uVar1 = *(uint *)(__result + 1);
      uVar4 = *__result;
      *(uint *)(__result + 1) = __c[2];
      *__result = *(undefined8 *)__c;
      __c[2] = uVar1;
      *(undefined8 *)__c = uVar4;
      return;
    }
  }
  else {
    bVar5 = uVar3 < uVar2;
    if ((uVar3 == uVar2) && (bVar5 = *__c < *__a, *__c == *__a)) {
      bVar5 = __c[1] < __a[1];
    }
    if (!bVar5) {
      bVar5 = uVar3 < uVar1;
      if ((uVar3 == uVar1) && (bVar5 = *__c < *__b, *__c == *__b)) {
        bVar5 = __c[1] < __b[1];
      }
      if (bVar5) goto LAB_0018e605;
      goto LAB_0018e630;
    }
  }
  uVar1 = *(uint *)(__result + 1);
  uVar4 = *__result;
  *(uint *)(__result + 1) = __a[2];
  *__result = *(undefined8 *)__a;
  __a[2] = uVar1;
  *(undefined8 *)__a = uVar4;
  return;
}

Assistant:

bool operator <(const VideoMode& left, const VideoMode& right)
{
    if (left.bitsPerPixel == right.bitsPerPixel)
    {
        if (left.width == right.width)
        {
            return left.height < right.height;
        }
        else
        {
            return left.width < right.width;
        }
    }
    else
    {
        return left.bitsPerPixel < right.bitsPerPixel;
    }
}